

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e handle_wait_ping_resp_timeout(pcp_server_t *s)

{
  pcp_flow_t *ppVar1;
  __suseconds_t _Var2;
  uint uVar3;
  pcp_flow_state_e pVar4;
  pcp_server_state_e pVar5;
  
  uVar3 = s->ping_count + 1;
  s->ping_count = uVar3;
  if (uVar3 < 5) {
    if (s->ping_flow_msg == (pcp_flow_t *)0x0) {
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    }
    else {
      pVar4 = handle_flow_event(s->ping_flow_msg,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
      if (pVar4 == pfs_failed) goto LAB_0010531f;
      ppVar1 = s->ping_flow_msg;
      if (ppVar1 != (pcp_flow_t *)0x0) {
        _Var2 = (ppVar1->timeout).tv_usec;
        (s->next_timeout).tv_sec = (ppVar1->timeout).tv_sec;
        (s->next_timeout).tv_usec = _Var2;
        return pss_wait_ping_resp;
      }
      (s->next_timeout).tv_sec = 0;
      (s->next_timeout).tv_usec = 0;
    }
    pVar5 = pss_ping;
  }
  else {
LAB_0010531f:
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    pVar5 = pss_set_not_working;
  }
  return pVar5;
}

Assistant:

static pcp_server_state_e handle_wait_ping_resp_timeout(pcp_server_t *s) {
    if (++s->ping_count >= PCP_MAX_PING_COUNT) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    if (!s->ping_flow_msg) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_ping;
    }

    if (handle_flow_event(s->ping_flow_msg, fev_flow_timedout, NULL) ==
        pfs_failed) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    if (s->ping_flow_msg) {
        s->next_timeout = s->ping_flow_msg->timeout;
    } else {
        s->next_timeout.tv_sec = 0;
        s->next_timeout.tv_usec = 0;
        return pss_ping;
    }
    return pss_wait_ping_resp;
}